

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

ConstTestCaseResultPtr __thiscall
xe::BatchResult::getTestCaseResult(BatchResult *this,char *casePath)

{
  char *in_RDX;
  ConstTestCaseResultPtr CVar1;
  allocator<char> local_49;
  key_type local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_28;
  const_iterator pos;
  char *casePath_local;
  BatchResult *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,in_RDX,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)(casePath + 0xf8),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::operator->(&local_28);
  CVar1 = getTestCaseResult(this,(int)casePath);
  CVar1.m_ptr = (TestCaseResultData *)this;
  return CVar1;
}

Assistant:

ConstTestCaseResultPtr BatchResult::getTestCaseResult (const char* casePath) const
{
	map<string, int>::const_iterator pos = m_resultMap.find(casePath);
	DE_ASSERT(pos != m_resultMap.end());
	return getTestCaseResult(pos->second);
}